

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

void __thiscall ON_Material::RemoveColorAlphaValues(ON_Material *this)

{
  uint uVar1;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_28;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_24;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_20;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_1c;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_18;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_14;
  ON_Material *local_10;
  ON_Material *this_local;
  
  local_10 = this;
  uVar1 = OnlyRGB(&this->m_ambient);
  ON_Color::ON_Color((ON_Color *)&local_14,uVar1);
  (this->m_ambient).field_0 = local_14;
  uVar1 = OnlyRGB(&this->m_diffuse);
  ON_Color::ON_Color((ON_Color *)&local_18,uVar1);
  (this->m_diffuse).field_0 = local_18;
  uVar1 = OnlyRGB(&this->m_emission);
  ON_Color::ON_Color((ON_Color *)&local_1c,uVar1);
  (this->m_emission).field_0 = local_1c;
  uVar1 = OnlyRGB(&this->m_specular);
  ON_Color::ON_Color((ON_Color *)&local_20,uVar1);
  (this->m_specular).field_0 = local_20;
  uVar1 = OnlyRGB(&this->m_reflection);
  ON_Color::ON_Color((ON_Color *)&local_24,uVar1);
  (this->m_reflection).field_0 = local_24;
  uVar1 = OnlyRGB(&this->m_transparent);
  ON_Color::ON_Color((ON_Color *)&local_28,uVar1);
  (this->m_transparent).field_0 = local_28;
  return;
}

Assistant:

void ON_Material::RemoveColorAlphaValues(void)
{
  m_ambient = OnlyRGB(m_ambient);
  m_diffuse = OnlyRGB(m_diffuse);
  m_emission = OnlyRGB(m_emission);
  m_specular = OnlyRGB(m_specular);
  m_reflection = OnlyRGB(m_reflection);
  m_transparent = OnlyRGB(m_transparent);
  
}